

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

uchar * stbtt_GetGlyphSDF(stbtt_fontinfo *info,float scale,int glyph,int padding,uchar onedge_value,
                         float pixel_dist_scale,int *width,int *height,int *xoff,int *yoff)

{
  short sVar1;
  short sVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  ushort uVar7;
  ushort uVar8;
  uint uVar9;
  undefined8 *puVar10;
  long lVar11;
  bool bVar12;
  byte bVar13;
  stbtt_vertex *psVar14;
  stbtt_fontinfo *psVar15;
  uint uVar17;
  byte bVar16;
  nk_allocator *alloc;
  int iVar18;
  undefined7 in_register_00000009;
  int iVar19;
  int iVar20;
  int iVar21;
  stbtt_vertex *psVar22;
  int iVar23;
  int iVar24;
  ushort uVar25;
  ushort uVar26;
  ushort uVar27;
  long lVar28;
  ulong uVar29;
  ulong uVar30;
  uchar *puVar31;
  long lVar32;
  bool bVar33;
  uint uVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float in_XMM0_Db;
  double dVar41;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  undefined4 in_XMM0_Dc;
  float extraout_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  undefined1 auVar42 [16];
  undefined1 extraout_var [12];
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar43 [16];
  float extraout_XMM0_Dd;
  undefined1 extraout_var_00 [12];
  undefined1 extraout_var_01 [12];
  float extraout_XMM0_Dd_00;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float in_XMM4_Da;
  float fVar51;
  float fVar52;
  float in_XMM4_Db;
  float in_XMM4_Dc;
  float fVar53;
  float in_XMM4_Dd;
  float in_XMM5_Da;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float in_XMM9_Db;
  float fVar62;
  float in_XMM9_Dc;
  float fVar63;
  float in_XMM9_Dd;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float in_XMM15_Db;
  float in_XMM15_Dc;
  float in_XMM15_Dd;
  int ix1;
  int ix0;
  stbtt_vertex *verts;
  int local_1f0;
  int local_1e8;
  int local_1e4;
  int local_1e0;
  int local_1dc;
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  undefined8 local_1a8;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  int local_184;
  float local_180;
  int local_17c;
  undefined8 local_178;
  undefined8 uStack_170;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  long local_148;
  ulong local_140;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  uchar *local_100;
  ulong local_f8;
  stbtt_vertex *local_f0;
  float local_e8;
  float local_e4;
  float local_e0;
  float local_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float local_c8;
  float fStack_c4;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  stbtt_fontinfo *local_b0;
  undefined1 local_a8 [16];
  undefined8 local_98;
  ulong uStack_90;
  float local_88;
  float fStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  stbtt_vertex *local_78;
  double local_70;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  undefined8 extraout_XMM0_Qb_00;
  
  if ((scale != 0.0) || (NAN(scale))) {
    local_1c8 = (float)CONCAT71(in_register_00000009,onedge_value);
    local_180 = pixel_dist_scale;
    local_c8 = scale;
    fStack_c4 = in_XMM0_Db;
    uStack_c0 = in_XMM0_Dc;
    uStack_bc = in_XMM0_Dd;
    local_b0 = info;
    stbtt_GetGlyphBitmapBoxSubpixel
              (info,glyph,scale,scale,0.0,0.0,&local_1dc,&local_1e4,&local_1e0,&local_1e8);
    psVar15 = local_b0;
    if ((local_1dc != local_1e0) && (local_1e4 != local_1e8)) {
      local_1dc = local_1dc - padding;
      local_1e4 = local_1e4 - padding;
      local_1e0 = local_1e0 + padding;
      local_1e8 = local_1e8 + padding;
      iVar21 = local_1e0 - local_1dc;
      if (width != (int *)0x0) {
        *width = iVar21;
      }
      iVar20 = local_1e8 - local_1e4;
      if (height != (int *)0x0) {
        *height = iVar20;
      }
      if (xoff != (int *)0x0) {
        *xoff = local_1dc;
      }
      if (yoff != (int *)0x0) {
        *yoff = local_1e4;
      }
      local_98 = CONCAT44(fStack_c4,local_c8) ^ 0x8000000080000000;
      uStack_90 = CONCAT44(uStack_bc,uStack_c0) ^ 0x8000000080000000;
      uVar17 = stbtt_GetGlyphShape(local_b0,glyph,&local_f0);
      puVar10 = (undefined8 *)psVar15->userdata;
      local_100 = (uchar *)(*(code *)puVar10[1])(*puVar10,0,(long)(iVar20 * iVar21));
      puVar10 = (undefined8 *)psVar15->userdata;
      local_f8 = (ulong)uVar17;
      local_148 = (*(code *)puVar10[1])(*puVar10,0,(long)(int)uVar17 * 4);
      psVar14 = local_f0;
      local_140 = (ulong)uVar17;
      if (0 < (int)uVar17) {
        iVar20 = (int)local_f8 + -1;
        uVar30 = 0;
        local_1d8 = local_c8;
        fStack_1d4 = local_c8;
        fStack_1d0 = local_c8;
        fStack_1cc = local_c8;
        psVar22 = local_f0;
        fVar64 = local_c8;
        fVar65 = local_c8;
        fVar36 = local_c8;
        do {
          if (psVar22->type == '\x03') {
            fVar35 = (float)(int)psVar22->cx * fVar64;
            in_XMM4_Db = 0.0;
            in_XMM4_Dc = 0.0;
            in_XMM4_Dd = 0.0;
            in_XMM4_Da = (float)(int)psVar22->cy * (float)local_98;
            fVar35 = ((float)(int)psVar22->x * fVar64 - (fVar35 + fVar35)) +
                     (float)(int)psVar14[iVar20].x * fVar64;
            in_XMM4_Da = in_XMM4_Da + in_XMM4_Da;
            in_XMM5_Da = ((float)(int)psVar22->y * (float)local_98 - in_XMM4_Da) -
                         (float)(int)psVar14[iVar20].y * fVar64;
            in_XMM5_Da = in_XMM5_Da * in_XMM5_Da;
            fVar44 = fVar35 * fVar35 + in_XMM5_Da;
            fVar35 = 0.0;
            if ((fVar44 != 0.0) || (NAN(fVar44))) {
              fVar35 = 1.0 / fVar44;
            }
          }
          else {
            fVar35 = 0.0;
            if (psVar22->type == '\x02') {
              fVar35 = (float)(int)psVar14[iVar20].x * fVar65 -
                       (float)(int)((long)((ulong)(ushort)psVar22->x << 0x30) >> 0x30) * fVar36;
              fVar44 = (float)(int)psVar22->y * fVar65 -
                       (float)(int)((long)((ulong)(ushort)psVar14[iVar20].y << 0x30) >> 0x30) *
                       fVar36;
              fVar35 = fVar35 * fVar35 + fVar44 * fVar44;
              if (fVar35 < 0.0) {
                fVar35 = sqrtf(fVar35);
                fVar64 = local_c8;
                fVar65 = local_1d8;
                fVar36 = fStack_1d4;
              }
              else {
                fVar35 = SQRT(fVar35);
              }
              fVar35 = (float)(~-(uint)(fVar35 == 0.0) & (uint)(1.0 / fVar35));
            }
          }
          in_XMM9_Dd = 0.0;
          in_XMM9_Dc = 0.0;
          in_XMM9_Db = 0.0;
          *(float *)(local_148 + uVar30 * 4) = fVar35;
          iVar20 = (int)uVar30;
          uVar30 = uVar30 + 1;
          psVar22 = psVar22 + 1;
        } while (local_140 != uVar30);
      }
      psVar14 = local_f0;
      local_1f0 = local_1e4;
      puVar31 = local_100;
      lVar32 = local_148;
      if (local_1e4 < local_1e8) {
        local_e0 = (float)((uint)local_1c8 & 0xff);
        lVar11 = local_140 * 0xe;
        local_78 = local_f0 + -1;
        local_158 = local_c8;
        fStack_154 = (float)local_98;
        fStack_150 = fStack_c4;
        fStack_14c = local_98._4_4_;
        local_184 = iVar21;
        do {
          if (local_1dc < local_1e0) {
            fVar64 = (float)local_1f0 + 0.5;
            local_e4 = fVar64 / (float)local_98;
            local_70 = (double)local_e4;
            local_e8 = local_e4 + -0.01;
            local_dc = local_e4 + 0.01;
            iVar21 = local_1dc;
            do {
              fVar36 = (float)iVar21 + 0.5;
              dVar41 = fmod(local_70,1.0);
              uVar30 = local_140;
              fVar65 = local_dc;
              if ((0.01 <= (float)dVar41) && (fVar65 = local_e4, 0.99 < (float)dVar41)) {
                fVar65 = local_e8;
              }
              fVar35 = local_158;
              fVar44 = fStack_154;
              fVar62 = fStack_150;
              fVar63 = fStack_14c;
              local_17c = iVar21;
              if ((int)local_f8 < 1) {
                bVar33 = true;
              }
              else {
                local_1c8 = fVar36 / local_c8;
                local_168 = fVar65 * 0.0 + local_1c8;
                local_1d8 = local_1c8 * 0.0 - fVar65;
                lVar28 = 0;
                iVar21 = 0;
                fVar66 = in_XMM9_Db;
                fVar67 = in_XMM9_Dc;
                fVar68 = in_XMM9_Dd;
                do {
                  if ((&psVar14->type)[lVar28] == '\x02') {
                    sVar1 = *(short *)((long)psVar14 + lVar28 + -0xc);
                    iVar18 = (int)sVar1;
                    sVar2 = *(short *)((long)&psVar14->y + lVar28);
                    iVar19 = (int)sVar2;
                    iVar20 = iVar19;
                    if (sVar1 < sVar2) {
                      iVar20 = iVar18;
                    }
                    if ((float)iVar20 < fVar65) {
                      iVar20 = iVar19;
                      if (sVar2 < sVar1) {
                        iVar20 = iVar18;
                      }
                      if (fVar65 < (float)iVar20) {
                        iVar23 = (int)*(short *)((long)&psVar14[-1].x + lVar28);
                        iVar24 = (int)*(short *)((long)&psVar14->x + lVar28);
                        iVar20 = iVar24;
                        if (iVar23 < iVar24) {
                          iVar20 = iVar23;
                        }
                        if ((float)iVar20 < local_1c8) {
                          iVar20 = (uint)(sVar1 < sVar2) * 2 + -1;
                          if (local_1c8 <=
                              (float)iVar23 +
                              (float)(iVar24 - iVar23) *
                              ((fVar65 - (float)iVar18) / (float)(iVar19 - iVar18))) {
                            iVar20 = 0;
                          }
                          iVar21 = iVar21 + iVar20;
                        }
                      }
                    }
                  }
                  in_XMM9_Db = fVar66;
                  in_XMM9_Dc = fVar67;
                  in_XMM9_Dd = fVar68;
                  if ((&psVar14->type)[lVar28] == '\x03') {
                    uVar3 = *(ushort *)((long)&psVar14[-1].x + lVar28);
                    iVar20 = (int)(short)uVar3;
                    uVar4 = *(ushort *)((long)&psVar14->cx + lVar28);
                    uVar5 = *(ushort *)((long)&psVar14->cy + lVar28);
                    uVar6 = *(ushort *)((long)&psVar14->x + lVar28);
                    iVar18 = (int)(short)uVar6;
                    uVar25 = uVar4;
                    if ((short)uVar6 <= (short)uVar4) {
                      uVar25 = uVar6;
                    }
                    uVar7 = *(ushort *)((long)&psVar14->y + lVar28);
                    iVar19 = (int)(short)uVar7;
                    if ((short)uVar3 <= (short)uVar25) {
                      uVar25 = uVar3;
                    }
                    uVar27 = uVar7;
                    if ((short)uVar5 < (short)uVar7) {
                      uVar27 = uVar5;
                    }
                    uVar8 = *(ushort *)((long)psVar14 + lVar28 + -0xc);
                    iVar23 = (int)(short)uVar8;
                    uVar26 = uVar5;
                    if ((short)uVar5 <= (short)uVar7) {
                      uVar26 = uVar7;
                    }
                    if ((short)uVar8 < (short)uVar27) {
                      uVar27 = uVar8;
                    }
                    if ((short)uVar26 < (short)uVar8) {
                      uVar26 = uVar8;
                    }
                    if ((((float)(int)(short)uVar27 < fVar65) &&
                        (fVar65 < (float)(int)(short)uVar26)) &&
                       ((float)(int)(short)uVar25 < local_1c8)) {
                      fVar48 = (float)(int)(short)uVar6;
                      fVar50 = (float)(int)((long)((ulong)uVar3 << 0x30) >> 0x30);
                      fVar57 = (float)(int)(short)uVar7;
                      fVar59 = (float)(int)((long)((ulong)uVar8 << 0x30) >> 0x30);
                      fVar60 = (float)(int)(short)uVar4;
                      fVar73 = (float)(int)(short)uVar5;
                      if ((fVar50 != fVar60) || (NAN(fVar50) || NAN(fVar60))) {
LAB_00112fdc:
                        if ((((fVar48 != fVar60) || (NAN(fVar48) || NAN(fVar60))) ||
                            (fVar57 != fVar73)) || (NAN(fVar57) || NAN(fVar73))) {
                          fVar58 = (float)((uint)-fVar50 & 0x80000000);
                          fVar47 = (float)((uint)-fVar50 & 0x80000000);
                          fVar40 = (float)((uint)-fVar50 & 0x80000000);
                          fVar38 = (float)((uint)-fVar50 & 0x80000000) + fVar59;
                          fVar69 = (float)((uint)-fVar60 & 0x80000000) + fVar73;
                          fVar72 = (fVar38 - (fVar69 + fVar69)) +
                                   (float)((uint)-fVar48 & 0x80000000) + fVar57;
                          fVar69 = fVar69 - fVar38;
                          fVar70 = in_XMM4_Db;
                          fVar53 = in_XMM4_Dc;
                          fVar71 = in_XMM4_Dd;
                          if ((fVar72 != 0.0) || (NAN(fVar72))) {
                            fVar37 = fVar69 * fVar69 - (fVar38 + local_1d8) * fVar72;
                            fVar39 = 0.0;
                            bVar16 = 0;
                            fVar38 = 0.0;
                            in_XMM9_Db = 0.0;
                            in_XMM9_Dc = 0.0;
                            in_XMM9_Dd = 0.0;
                            if (0.0 < fVar37) {
                              local_178 = CONCAT44(fVar50,fVar48);
                              uStack_170 = 0;
                              local_138 = in_XMM4_Da;
                              fStack_134 = in_XMM4_Db;
                              fStack_130 = in_XMM4_Dc;
                              fStack_12c = in_XMM4_Dd;
                              if (fVar37 < 0.0) {
                                local_a8._0_4_ = in_XMM5_Da;
                                uStack_80 = 0;
                                uStack_7c = 0;
                                local_1b8 = fVar60;
                                fStack_1b4 = fVar66;
                                fStack_1b0 = fVar67;
                                fStack_1ac = fVar68;
                                local_88 = fVar57;
                                fStack_84 = fVar59;
                                local_68 = fVar72;
                                fStack_64 = fVar58;
                                fStack_60 = fVar47;
                                fStack_5c = fVar40;
                                local_58 = fVar69;
                                fStack_54 = (float)((uint)-fVar66 & 0x80000000);
                                fStack_50 = (float)((uint)-fVar67 & 0x80000000);
                                fStack_4c = (float)((uint)-fVar68 & 0x80000000);
                                local_48 = fVar73;
                                fStack_44 = in_XMM15_Db;
                                fStack_40 = in_XMM15_Dc;
                                fStack_3c = in_XMM15_Dd;
                                fVar37 = sqrtf(fVar37);
                                in_XMM5_Da = (float)local_a8._0_4_;
                                fVar60 = local_1b8;
                                fVar66 = fStack_1b4;
                                fVar67 = fStack_1b0;
                                fVar68 = fStack_1ac;
                                fVar35 = local_158;
                                fVar44 = fStack_154;
                                fVar62 = fStack_150;
                                fVar63 = fStack_14c;
                                fVar72 = local_68;
                                fVar58 = fStack_64;
                                fVar47 = fStack_60;
                                fVar40 = fStack_5c;
                                fVar69 = local_58;
                                in_XMM9_Db = fStack_54;
                                in_XMM9_Dc = fStack_50;
                                in_XMM9_Dd = fStack_4c;
                                fVar73 = local_48;
                                in_XMM15_Db = fStack_44;
                                in_XMM15_Dc = fStack_40;
                                in_XMM15_Dd = fStack_3c;
                                fVar57 = local_88;
                                fVar59 = fStack_84;
                              }
                              else {
                                fVar37 = SQRT(fVar37);
                                in_XMM9_Db = (float)((uint)-fVar66 & 0x80000000);
                                in_XMM9_Dc = (float)((uint)-fVar67 & 0x80000000);
                                in_XMM9_Dd = (float)((uint)-fVar68 & 0x80000000);
                              }
                              fVar38 = (fVar69 + fVar37) * (-1.0 / fVar72);
                              fVar39 = (fVar69 - fVar37) * (-1.0 / fVar72);
                              bVar16 = -(0.0 <= fVar38 && fVar38 <= 1.0) & 1;
                              fVar48 = (float)local_178;
                              fVar50 = local_178._4_4_;
                              in_XMM4_Da = local_138;
                              fVar70 = fStack_134;
                              fVar53 = fStack_130;
                              fVar71 = fStack_12c;
                              if (((0.0 < fVar37) && (0.0 <= fVar39)) && (fVar39 <= 1.0)) {
                                if (bVar16 == 0) {
                                  fVar38 = fVar39;
                                }
                                bVar16 = bVar16 + 1;
                              }
                            }
                          }
                          else {
                            fVar38 = (fVar38 + local_1d8) / (fVar69 * -2.0);
                            fVar39 = 0.0;
                            bVar16 = -(0.0 <= fVar38 && fVar38 <= 1.0) & 1;
                            in_XMM9_Db = fVar58;
                            in_XMM9_Dc = fVar47;
                            in_XMM9_Dd = fVar40;
                            local_1b8 = fVar60;
                            fStack_1b4 = fVar66;
                            fStack_1b0 = fVar67;
                            fStack_1ac = fVar68;
                          }
                          in_XMM4_Dd = fVar40;
                          in_XMM4_Dc = fVar47;
                          in_XMM4_Db = fVar58;
                          if (bVar16 == 0) {
                            bVar33 = false;
                            in_XMM4_Db = fVar70;
                            in_XMM4_Dc = fVar53;
                            in_XMM4_Dd = fVar71;
                            in_XMM9_Db = fVar66;
                            in_XMM9_Dc = fVar67;
                            in_XMM9_Dd = fVar68;
                          }
                          else {
                            in_XMM15_Db = (float)((uint)in_XMM15_Db & 0x80000000);
                            in_XMM15_Dc = (float)((uint)in_XMM15_Dc & 0x80000000);
                            in_XMM15_Dd = (float)((uint)in_XMM15_Dd & 0x80000000);
                            fVar50 = (float)((uint)fVar59 & 0x80000000) + fVar50;
                            fVar67 = ((float)((uint)fVar73 & 0x80000000) + fVar60) - fVar50;
                            fVar66 = ((float)((uint)fVar57 & 0x80000000) + fVar48) - fVar50;
                            in_XMM5_Da = fVar38 * fVar38 * fVar66 +
                                         (2.0 - (fVar38 + fVar38)) * fVar38 * fVar67 +
                                         (fVar50 - local_168);
                            in_XMM4_Da = fVar72 * fVar38 + fVar69;
                            bVar33 = bVar16 != 1;
                            if (bVar33) {
                              local_198 = fVar39 * fVar39 * fVar66 +
                                          (2.0 - (fVar39 + fVar39)) * fVar39 * fVar67 +
                                          (fVar50 - local_168);
                              local_118 = fVar72 * fVar39 + fVar69;
                            }
                          }
                          iVar20 = ((0.0 <= in_XMM4_Da) - 1) + (uint)(0.0 <= in_XMM4_Da);
                          if (0.0 <= in_XMM5_Da) {
                            iVar20 = 0;
                          }
                          if (bVar16 == 0) {
                            iVar20 = 0;
                          }
                          iVar18 = (uint)(0.0 <= local_118) * 2 + -1;
                          if (0.0 <= local_198) {
                            iVar18 = 0;
                          }
                          if (!bVar33) {
                            iVar18 = 0;
                          }
                          iVar21 = iVar21 + iVar18 + iVar20;
                          goto LAB_001133b6;
                        }
                      }
                      else if ((fVar59 != fVar73) || (NAN(fVar59) || NAN(fVar73)))
                      goto LAB_00112fdc;
                      iVar24 = iVar19;
                      if ((short)uVar8 < (short)uVar7) {
                        iVar24 = iVar23;
                      }
                      if ((float)iVar24 < fVar65) {
                        iVar24 = iVar19;
                        if ((short)uVar7 < (short)uVar8) {
                          iVar24 = iVar23;
                        }
                        if (fVar65 < (float)iVar24) {
                          iVar24 = iVar18;
                          if (iVar20 < iVar18) {
                            iVar24 = iVar20;
                          }
                          if ((float)iVar24 < local_1c8) {
                            iVar24 = (uint)((short)uVar8 < (short)uVar7) * 2 + -1;
                            if (local_1c8 <=
                                (float)(iVar18 - iVar20) *
                                ((fVar65 - fVar59) / (float)(iVar19 - iVar23)) + fVar50) {
                              iVar24 = 0;
                            }
                            iVar21 = iVar21 + iVar24;
                          }
                        }
                      }
                    }
                  }
LAB_001133b6:
                  lVar28 = lVar28 + 0xe;
                  fVar66 = in_XMM9_Db;
                  fVar67 = in_XMM9_Dc;
                  fVar68 = in_XMM9_Dd;
                } while (lVar11 != lVar28);
                bVar33 = iVar21 == 0;
              }
              if ((int)local_f8 < 1) {
                fVar65 = 999999.0;
              }
              else {
                uVar29 = 0;
                fVar65 = 999999.0;
                fVar66 = 0.0;
                fVar67 = 0.0;
                fVar68 = 0.0;
                psVar22 = local_78;
                do {
                  uVar17._0_2_ = psVar22[1].x;
                  uVar17._2_2_ = psVar22[1].y;
                  auVar42 = pshuflw(ZEXT416(uVar17),ZEXT416(uVar17),0x60);
                  fVar70 = (float)(auVar42._0_4_ >> 0x10) * fVar35;
                  fVar50 = (float)(auVar42._4_4_ >> 0x10) * fVar44;
                  fVar71 = (float)(auVar42._8_4_ >> 0x10) * fVar62;
                  fVar72 = (float)(auVar42._12_4_ >> 0x10) * fVar63;
                  fVar58 = fVar70 - fVar36;
                  fVar48 = fVar50 - fVar64;
                  fVar38 = fVar58 * fVar58 + fVar48 * fVar48;
                  fVar60 = fVar50;
                  fVar73 = fVar50;
                  fVar57 = fVar50;
                  fVar59 = fVar50;
                  fVar53 = fVar50;
                  fVar47 = fVar50;
                  fVar40 = fVar71;
                  fVar69 = fVar72;
                  if (fVar38 < fVar65 * fVar65) {
                    if (fVar38 < 0.0) {
                      local_1d8 = fVar50;
                      fStack_1d4 = fVar50;
                      fStack_1d0 = fVar50;
                      fStack_1cc = fVar50;
                      local_1c8 = fVar58;
                      fStack_1c4 = fVar50;
                      fStack_1c0 = fVar71;
                      fStack_1bc = fVar72;
                      local_198 = fVar70;
                      fStack_194 = fVar50;
                      fStack_190 = fVar71;
                      fStack_18c = fVar72;
                      local_118 = fVar48;
                      fStack_114 = fVar50;
                      fStack_110 = fVar50;
                      fStack_10c = fVar50;
                      fVar65 = sqrtf(fVar38);
                      fVar66 = extraout_var._0_4_;
                      fVar67 = extraout_var._4_4_;
                      fVar68 = extraout_var._8_4_;
                      fVar48 = local_118;
                      fVar50 = fStack_114;
                      fVar35 = local_158;
                      fVar44 = fStack_154;
                      fVar62 = fStack_150;
                      fVar63 = fStack_14c;
                      fVar60 = local_1d8;
                      fVar73 = fStack_1d4;
                      fVar57 = fStack_1d0;
                      fVar59 = fStack_1cc;
                      fVar70 = local_198;
                      fVar53 = fStack_194;
                      fVar71 = fStack_190;
                      fVar72 = fStack_18c;
                      fVar58 = local_1c8;
                      fVar47 = fStack_1c4;
                      fVar40 = fStack_1c0;
                      fVar69 = fStack_1bc;
                    }
                    else {
                      fVar66 = 0.0;
                      fVar67 = 0.0;
                      fVar68 = 0.0;
                      fVar65 = SQRT(fVar38);
                    }
                  }
                  if (psVar22[1].type == '\x03') {
                    uVar34._0_2_ = psVar22->x;
                    uVar34._2_2_ = psVar22->y;
                    auVar42 = pshuflw(ZEXT416(uVar34),ZEXT416(uVar34),0x60);
                    fVar38 = (float)(auVar42._0_4_ >> 0x10) * fVar35;
                    in_XMM15_Db = (float)(auVar42._4_4_ >> 0x10) * fVar44;
                    in_XMM15_Dc = (float)(auVar42._8_4_ >> 0x10) * fVar62;
                    in_XMM15_Dd = (float)(auVar42._12_4_ >> 0x10) * fVar63;
                    uVar9._0_2_ = psVar22[1].cx;
                    uVar9._2_2_ = psVar22[1].cy;
                    auVar42 = pshuflw(ZEXT416(uVar9),ZEXT416(uVar9),0x60);
                    in_XMM5_Da = (float)(auVar42._0_4_ >> 0x10) * fVar35;
                    fVar54 = (float)(auVar42._4_4_ >> 0x10) * fVar44;
                    fVar55 = (float)(auVar42._8_4_ >> 0x10) * fVar62;
                    fVar56 = (float)(auVar42._12_4_ >> 0x10) * fVar63;
                    uVar17 = -(uint)(fVar70 < in_XMM5_Da);
                    uVar34 = -(uint)(fVar53 < fVar54);
                    fVar39 = (float)(~uVar34 & (uint)fVar53 | (uint)fVar54 & uVar34);
                    fVar45 = (float)(~uVar17 & (uint)fVar70 | (uint)in_XMM5_Da & uVar17);
                    fVar46 = (float)(~uVar34 & (uint)fVar54 | (uint)fVar53 & uVar34);
                    fVar52 = (float)(~uVar17 & (uint)in_XMM5_Da | (uint)fVar70 & uVar17);
                    auVar42._4_4_ = -(uint)(fVar45 < fVar38);
                    auVar42._0_4_ = -(uint)(fVar39 < in_XMM15_Db);
                    auVar42._8_4_ = -(uint)(fVar46 < in_XMM15_Db);
                    auVar42._12_4_ = -(uint)(fVar52 < fVar38);
                    uVar17 = movmskps(3,auVar42);
                    fVar37 = fVar52;
                    if ((uVar17 & 8) == 0) {
                      fVar37 = fVar38;
                    }
                    fVar61 = fVar46;
                    if ((uVar17 & 4) == 0) {
                      fVar61 = in_XMM15_Db;
                    }
                    fVar49 = fVar38;
                    if ((uVar17 & 2) == 0) {
                      fVar49 = fVar45;
                    }
                    fVar51 = in_XMM15_Db;
                    in_XMM4_Db = in_XMM15_Db;
                    in_XMM4_Dc = in_XMM15_Db;
                    in_XMM4_Dd = in_XMM15_Db;
                    if ((uVar17 & 1) == 0) {
                      fVar51 = fVar39;
                      in_XMM4_Db = fVar45;
                      in_XMM4_Dc = fVar46;
                      in_XMM4_Dd = fVar52;
                    }
                    in_XMM4_Da = fVar51;
                    local_1c8 = in_XMM15_Db;
                    fStack_1c4 = in_XMM15_Db;
                    fStack_1c0 = in_XMM15_Db;
                    fStack_1bc = in_XMM15_Db;
                    if (((fVar37 - fVar65 < fVar36) && (fVar36 < fVar49 + fVar65)) &&
                       ((fVar61 - fVar65 < fVar64 &&
                        (in_XMM4_Da = fVar51 + fVar65, fVar64 < fVar51 + fVar65)))) {
                      fVar45 = in_XMM5_Da - fVar70;
                      in_XMM9_Db = fVar54 - fVar53;
                      in_XMM9_Dc = fVar55 - fVar71;
                      in_XMM9_Dd = fVar56 - fVar72;
                      fVar46 = fVar54 - fVar60;
                      fVar39 = (fVar70 - (in_XMM5_Da + in_XMM5_Da)) + fVar38;
                      fVar52 = (fVar60 - (fVar54 + fVar54)) + in_XMM15_Db;
                      fVar37 = *(float *)(lVar32 + uVar29 * 4);
                      fVar61 = (fVar45 * fVar39 + fVar46 * fVar52) * 3.0;
                      local_168 = in_XMM5_Da;
                      fStack_164 = fVar54;
                      fStack_160 = fVar55;
                      fStack_15c = fVar56;
                      local_118 = fVar54;
                      fStack_114 = fVar54;
                      fStack_110 = fVar54;
                      fStack_10c = fVar54;
                      if ((fVar37 != 0.0) || (NAN(fVar37))) {
                        fVar61 = fVar61 * fVar37;
                        fVar35 = fVar45 * fVar45 + fVar46 * fVar46;
                        fVar35 = (fVar35 + fVar35 + fVar39 * fVar58 + fVar52 * fVar48) * fVar37;
                        local_128 = fVar61 / -3.0;
                        fVar40 = (fVar61 * fVar61) / -3.0 + fVar35;
                        fVar62 = (fVar61 + fVar61) * fVar61 + fVar35 * -9.0;
                        fVar63 = fVar47 * in_XMM9_Dc + fVar50 * 0.0;
                        fVar50 = in_XMM9_Db * in_XMM9_Dd + in_XMM9_Db * 0.0;
                        fVar61 = fVar61 * fVar62;
                        fVar35 = fVar61 / 27.0 + fVar37 * (fVar58 * fVar45 + fVar46 * fVar48);
                        fVar44 = fVar40 * fVar40 * fVar40;
                        fVar48 = fVar35 * fVar35 + (fVar44 * 4.0) / 27.0;
                        local_178 = CONCAT44(fVar61,fVar35);
                        uStack_170 = CONCAT44(fVar61,fVar61);
                        if (fVar48 < 0.0) {
                          fVar40 = fVar40 / -3.0;
                          if (fVar40 < 0.0) {
                            local_1a8 = (double)CONCAT44(in_XMM9_Db,fVar44);
                            local_1d8 = fVar60;
                            fStack_1d4 = fVar73;
                            fStack_1d0 = fVar57;
                            fStack_1cc = fVar59;
                            local_1b8 = fVar38;
                            fStack_1b4 = in_XMM15_Db;
                            fStack_1b0 = in_XMM15_Dc;
                            fStack_1ac = in_XMM15_Dd;
                            fStack_1a0 = in_XMM9_Dc;
                            fStack_19c = in_XMM9_Dd;
                            local_198 = fVar70;
                            fStack_194 = fVar53;
                            fStack_190 = fVar71;
                            fStack_18c = fVar72;
                            local_138 = fVar65;
                            fStack_134 = fVar66;
                            fStack_130 = fVar67;
                            fStack_12c = fVar68;
                            fStack_124 = in_XMM9_Db;
                            fStack_120 = in_XMM9_Dc;
                            fStack_11c = in_XMM9_Dd;
                            local_d8 = sqrtf(fVar40);
                            fVar44 = (float)local_1a8;
                          }
                          else {
                            local_d8 = SQRT(fVar40);
                            local_1d8 = fVar60;
                            fStack_1d4 = fVar73;
                            fStack_1d0 = fVar57;
                            fStack_1cc = fVar59;
                            local_1b8 = fVar38;
                            fStack_1b4 = in_XMM15_Db;
                            fStack_1b0 = in_XMM15_Dc;
                            fStack_1ac = in_XMM15_Dd;
                            local_198 = fVar70;
                            fStack_194 = fVar53;
                            fStack_190 = fVar71;
                            fStack_18c = fVar72;
                            local_138 = fVar65;
                            fStack_134 = fVar66;
                            fStack_130 = fVar67;
                            fStack_12c = fVar68;
                            fStack_124 = in_XMM9_Db;
                            fStack_120 = in_XMM9_Dc;
                            fStack_11c = in_XMM9_Dd;
                          }
                          in_XMM9_Dd = fVar50;
                          in_XMM9_Dc = fVar63;
                          in_XMM9_Db = fVar62;
                          dVar41 = (double)(-27.0 / fVar44);
                          if (dVar41 < 0.0) {
                            dVar41 = sqrt(dVar41);
                          }
                          else {
                            dVar41 = SQRT(dVar41);
                          }
                          dVar41 = acos((double)(float)local_178 * dVar41 * -0.5);
                          local_1a8 = (double)((float)dVar41 / 3.0);
                          dVar41 = cos(local_1a8);
                          local_178 = CONCAT44(local_178._4_4_,(float)dVar41);
                          dVar41 = cos(local_1a8 + -1.570796);
                          fVar48 = (local_d8 + local_d8) * (float)local_178 + local_128;
                          local_1a8 = (double)CONCAT44(fStack_124,
                                                       local_128 -
                                                       ((float)dVar41 * 1.7320508 + (float)local_178
                                                       ) * local_d8);
                          fStack_1a0 = fStack_120;
                          fStack_19c = fStack_11c;
                          local_d8 = local_128 -
                                     ((float)local_178 - (float)dVar41 * 1.7320508) * local_d8;
                          fStack_d4 = fStack_124;
                          fStack_d0 = fStack_120;
                          fStack_cc = fStack_11c;
                          fStack_124 = 0.0;
                          fStack_120 = 0.0;
                          fStack_11c = 0.0;
                          bVar16 = 1;
                          bVar13 = 1;
                        }
                        else {
                          if (fVar48 < 0.0) {
                            local_1d8 = fVar60;
                            fStack_1d4 = fVar73;
                            fStack_1d0 = fVar57;
                            fStack_1cc = fVar59;
                            local_1b8 = fVar38;
                            fStack_1b4 = in_XMM15_Db;
                            fStack_1b0 = in_XMM15_Dc;
                            fStack_1ac = in_XMM15_Dd;
                            local_198 = fVar70;
                            fStack_194 = fVar53;
                            fStack_190 = fVar71;
                            fStack_18c = fVar72;
                            local_138 = fVar65;
                            fStack_134 = fVar66;
                            fStack_130 = fVar67;
                            fStack_12c = fVar68;
                            fStack_124 = in_XMM9_Db;
                            fStack_120 = in_XMM9_Dc;
                            fStack_11c = in_XMM9_Dd;
                            local_88 = sqrtf(fVar48);
                            fVar35 = (float)local_178;
                          }
                          else {
                            local_88 = SQRT(fVar48);
                            local_1d8 = fVar60;
                            fStack_1d4 = fVar73;
                            fStack_1d0 = fVar57;
                            fStack_1cc = fVar59;
                            local_1b8 = fVar38;
                            fStack_1b4 = in_XMM15_Db;
                            fStack_1b0 = in_XMM15_Dc;
                            fStack_1ac = in_XMM15_Dd;
                            local_198 = fVar70;
                            fStack_194 = fVar53;
                            fStack_190 = fVar71;
                            fStack_18c = fVar72;
                            local_138 = fVar65;
                            fStack_134 = fVar66;
                            fStack_130 = fVar67;
                            fStack_12c = fVar68;
                            fStack_124 = in_XMM9_Db;
                            fStack_120 = in_XMM9_Dc;
                            fStack_11c = in_XMM9_Dd;
                          }
                          in_XMM9_Dd = fVar50;
                          in_XMM9_Dc = fVar63;
                          in_XMM9_Db = fVar62;
                          fVar65 = (local_88 - fVar35) * 0.5;
                          if (0.0 <= fVar65) {
                            auVar43._0_8_ = pow((double)fVar65,0.3333333432674408);
                            auVar43._8_8_ = extraout_XMM0_Qb_00;
                            local_a8._4_12_ = auVar43._4_12_;
                            local_a8._0_4_ = (undefined4)auVar43._0_8_;
                          }
                          else {
                            dVar41 = pow((double)-fVar65,0.3333333432674408);
                            local_a8._0_8_ =
                                 CONCAT44((int)((ulong)dVar41 >> 0x20),(float)dVar41) ^
                                 0x8000000080000000;
                            local_a8._8_4_ = (uint)extraout_XMM0_Qb ^ 0x80000000;
                            local_a8._12_4_ = (uint)((ulong)extraout_XMM0_Qb >> 0x20) ^ 0x80000000;
                          }
                          fVar65 = (-(float)local_178 - local_88) * 0.5;
                          if (0.0 <= fVar65) {
                            dVar41 = pow((double)fVar65,0.3333333432674408);
                            fVar48 = (float)dVar41;
                          }
                          else {
                            dVar41 = pow((double)-fVar65,0.3333333432674408);
                            fVar48 = -(float)dVar41;
                          }
                          fVar48 = local_128 + (float)local_a8._0_4_ + fVar48;
                          bVar16 = 0;
                          bVar13 = 0;
                        }
                        bVar12 = true;
                        fVar35 = local_158;
                        fVar44 = fStack_154;
                        fVar62 = fStack_150;
                        fVar63 = fStack_14c;
                        fVar65 = local_138;
                        fVar66 = fStack_134;
                        fVar67 = fStack_130;
                        fVar68 = fStack_12c;
                        fVar60 = local_1d8;
                        fVar73 = fStack_1d4;
                        fVar57 = fStack_1d0;
                        fVar59 = fStack_1cc;
                        fVar70 = local_198;
                        fVar53 = fStack_194;
                        fVar71 = fStack_190;
                        fVar72 = fStack_18c;
                        fVar38 = local_1b8;
                        in_XMM15_Db = fStack_1b4;
                        in_XMM15_Dc = fStack_1b0;
                        in_XMM15_Dd = fStack_1ac;
                      }
                      else {
                        fVar50 = fVar45 * fVar45 + fVar46 * fVar46;
                        fVar50 = fVar50 + fVar50 + fVar39 * fVar58 + fVar52 * fVar48;
                        fVar48 = fVar58 * fVar45 + fVar48 * fVar46;
                        if ((fVar61 != 0.0) || (NAN(fVar61))) {
                          fVar58 = fVar50 * fVar50 + fVar48 * fVar61 * -4.0;
                          if (fVar58 < 0.0) goto LAB_001138ac;
                          local_1a8._0_4_ = fVar50;
                          local_1a8._4_4_ = in_XMM9_Db;
                          local_128 = fVar61;
                          if (fVar58 < 0.0) {
                            local_1d8 = fVar60;
                            fStack_1d4 = fVar73;
                            fStack_1d0 = fVar57;
                            fStack_1cc = fVar59;
                            local_1b8 = fVar38;
                            fStack_1b4 = in_XMM15_Db;
                            fStack_1b0 = in_XMM15_Dc;
                            fStack_1ac = in_XMM15_Dd;
                            fStack_1a0 = in_XMM9_Dc;
                            fStack_19c = in_XMM9_Dd;
                            local_198 = fVar70;
                            fStack_194 = fVar53;
                            fStack_190 = fVar71;
                            fStack_18c = fVar72;
                            local_138 = fVar65;
                            fStack_134 = fVar66;
                            fStack_130 = fVar67;
                            fStack_12c = fVar68;
                            fStack_124 = in_XMM9_Db;
                            fStack_120 = in_XMM9_Dc;
                            fStack_11c = in_XMM9_Dd;
                            fVar58 = sqrtf(fVar58);
                            in_XMM9_Db = fStack_124;
                            in_XMM9_Dc = fStack_120;
                            in_XMM9_Dd = fStack_11c;
                            fVar35 = local_158;
                            fVar44 = fStack_154;
                            fVar62 = fStack_150;
                            fVar63 = fStack_14c;
                            fVar65 = local_138;
                            fVar66 = fStack_134;
                            fVar67 = fStack_130;
                            fVar68 = fStack_12c;
                            fVar60 = local_1d8;
                            fVar73 = fStack_1d4;
                            fVar57 = fStack_1d0;
                            fVar59 = fStack_1cc;
                            fVar70 = local_198;
                            fVar53 = fStack_194;
                            fVar71 = fStack_190;
                            fVar72 = fStack_18c;
                            fVar38 = local_1b8;
                            in_XMM15_Db = fStack_1b4;
                            in_XMM15_Dc = fStack_1b0;
                            in_XMM15_Dd = fStack_1ac;
                            fVar50 = extraout_XMM0_Db;
                            fVar47 = extraout_XMM0_Dd;
                          }
                          else {
                            fVar58 = SQRT(fVar58);
                            fStack_1a0 = in_XMM9_Dc;
                            fStack_19c = in_XMM9_Dd;
                            fVar50 = in_XMM9_Db;
                            fVar47 = in_XMM9_Dd;
                          }
                          fStack_124 = -local_1a8._4_4_;
                          fStack_120 = -fStack_1a0;
                          fStack_11c = -fStack_19c;
                          fVar48 = (-(float)local_1a8 - fVar58) / (local_128 + local_128);
                          local_1a8 = (double)CONCAT44(fVar50,(fVar58 - (float)local_1a8) /
                                                              (local_128 + local_128));
                          fStack_1a0 = 0.0;
                          bVar12 = true;
                          bVar13 = 0;
                          bVar16 = 1;
                          fStack_19c = fVar47;
                        }
                        else {
                          if ((fVar50 != 0.0) || (NAN(fVar50))) {
                            fStack_124 = -fVar47;
                            fStack_120 = -fVar40;
                            fStack_11c = -fVar69;
                            bVar12 = true;
                            fVar48 = -fVar48 / fVar50;
                          }
                          else {
LAB_001138ac:
                            bVar12 = false;
                            fVar48 = local_128;
                          }
                          bVar16 = 0;
                          bVar13 = 0;
                        }
                      }
                      local_128 = fVar48;
                      if (((bVar12) && (0.0 <= fVar48)) && (fVar48 <= 1.0)) {
                        fVar58 = 1.0 - fVar48;
                        fVar47 = (fVar48 + fVar48) * fVar58;
                        fVar50 = (fVar48 * fVar48 * fVar38 +
                                 fVar58 * fVar58 * fVar70 + local_168 * fVar47) - fVar36;
                        fVar48 = (fVar48 * fVar48 * local_1c8 +
                                 fVar58 * fVar58 * fVar60 + fVar47 * local_118) - fVar64;
                        fVar48 = fVar50 * fVar50 + fVar48 * fVar48;
                        if (fVar48 < fVar65 * fVar65) {
                          if (fVar48 < 0.0) {
                            local_1d8 = fVar60;
                            fStack_1d4 = fVar73;
                            fStack_1d0 = fVar57;
                            fStack_1cc = fVar59;
                            local_1b8 = fVar38;
                            fStack_1b4 = in_XMM15_Db;
                            fStack_1b0 = in_XMM15_Dc;
                            fStack_1ac = in_XMM15_Dd;
                            local_198 = fVar70;
                            fStack_194 = fVar53;
                            fStack_190 = fVar71;
                            fStack_18c = fVar72;
                            fVar65 = sqrtf(fVar48);
                            fVar66 = extraout_var_00._0_4_;
                            fVar67 = extraout_var_00._4_4_;
                            fVar68 = extraout_var_00._8_4_;
                            fVar35 = local_158;
                            fVar44 = fStack_154;
                            fVar62 = fStack_150;
                            fVar63 = fStack_14c;
                            fVar60 = local_1d8;
                            fVar73 = fStack_1d4;
                            fVar57 = fStack_1d0;
                            fVar59 = fStack_1cc;
                            fVar70 = local_198;
                            fVar53 = fStack_194;
                            fVar71 = fStack_190;
                            fVar72 = fStack_18c;
                            fVar38 = local_1b8;
                            in_XMM15_Db = fStack_1b4;
                            in_XMM15_Dc = fStack_1b0;
                            in_XMM15_Dd = fStack_1ac;
                          }
                          else {
                            fVar66 = 0.0;
                            fVar67 = 0.0;
                            fVar68 = 0.0;
                            fVar65 = SQRT(fVar48);
                          }
                        }
                      }
                      uVar30 = local_140;
                      if ((bool)(bVar16 & ((float)local_1a8 <= 1.0 && 0.0 <= (float)local_1a8))) {
                        fVar50 = 1.0 - (float)local_1a8;
                        fVar58 = ((float)local_1a8 + (float)local_1a8) * fVar50;
                        fVar48 = ((float)local_1a8 * (float)local_1a8 * fVar38 +
                                 fVar50 * fVar50 * fVar70 + local_168 * fVar58) - fVar36;
                        fVar50 = ((float)local_1a8 * (float)local_1a8 * local_1c8 +
                                 fVar50 * fVar50 * fVar60 + fVar58 * local_118) - fVar64;
                        fVar48 = fVar48 * fVar48 + fVar50 * fVar50;
                        if (fVar48 < fVar65 * fVar65) {
                          if (fVar48 < 0.0) {
                            local_1d8 = fVar60;
                            fStack_1d4 = fVar73;
                            fStack_1d0 = fVar57;
                            fStack_1cc = fVar59;
                            local_1b8 = fVar38;
                            fStack_1b4 = in_XMM15_Db;
                            fStack_1b0 = in_XMM15_Dc;
                            fStack_1ac = in_XMM15_Dd;
                            local_198 = fVar70;
                            fStack_194 = fVar53;
                            fStack_190 = fVar71;
                            fStack_18c = fVar72;
                            fVar65 = sqrtf(fVar48);
                            fVar66 = extraout_var_01._0_4_;
                            fVar67 = extraout_var_01._4_4_;
                            fVar68 = extraout_var_01._8_4_;
                            fVar35 = local_158;
                            fVar44 = fStack_154;
                            fVar62 = fStack_150;
                            fVar63 = fStack_14c;
                            fVar60 = local_1d8;
                            fVar70 = local_198;
                            fVar38 = local_1b8;
                            in_XMM15_Db = fStack_1b4;
                            in_XMM15_Dc = fStack_1b0;
                            in_XMM15_Dd = fStack_1ac;
                          }
                          else {
                            fVar66 = 0.0;
                            fVar67 = 0.0;
                            fVar68 = 0.0;
                            fVar65 = SQRT(fVar48);
                          }
                        }
                      }
                      lVar32 = local_148;
                      in_XMM4_Da = local_d8;
                      in_XMM4_Db = fStack_d4;
                      in_XMM4_Dc = fStack_d0;
                      in_XMM4_Dd = fStack_cc;
                      in_XMM5_Da = local_168;
                      if ((bool)(bVar13 & (0.0 <= local_d8 && local_d8 <= 1.0))) {
                        fVar50 = 1.0 - local_d8;
                        fVar73 = (local_d8 + local_d8) * fVar50;
                        in_XMM5_Da = local_168 * fVar73;
                        fVar48 = (local_d8 * local_d8 * fVar38 +
                                 fVar50 * fVar50 * fVar70 + in_XMM5_Da) - fVar36;
                        in_XMM4_Da = (local_d8 * local_d8 * local_1c8 +
                                     fVar50 * fVar50 * fVar60 + local_118 * fVar73) - fVar64;
                        in_XMM4_Da = in_XMM4_Da * in_XMM4_Da;
                        fVar48 = fVar48 * fVar48 + in_XMM4_Da;
                        if (fVar48 < fVar65 * fVar65) {
                          if (fVar48 < 0.0) {
                            fVar65 = sqrtf(fVar48);
                            fVar35 = local_158;
                            fVar44 = fStack_154;
                            fVar62 = fStack_150;
                            fVar63 = fStack_14c;
                            fVar66 = extraout_XMM0_Db_00;
                            fVar67 = extraout_XMM0_Dc;
                            fVar68 = extraout_XMM0_Dd_00;
                          }
                          else {
                            fVar66 = 0.0;
                            fVar67 = 0.0;
                            fVar68 = 0.0;
                            fVar65 = SQRT(fVar48);
                          }
                        }
                      }
                    }
                  }
                  else {
                    in_XMM5_Da = fVar48;
                    if (psVar22[1].type == '\x02') {
                      fVar70 = (float)(int)psVar22->x * local_c8 - fVar70;
                      fVar60 = (float)(int)psVar22->y * (float)local_98 - fVar60;
                      fVar50 = ABS(fVar70 * fVar48 - fVar58 * fVar60) *
                               *(float *)(lVar32 + uVar29 * 4);
                      if (fVar50 < fVar65) {
                        in_XMM5_Da = fVar48 * fVar60;
                        fVar48 = -(fVar58 * fVar70 + in_XMM5_Da) /
                                 (fVar70 * fVar70 + fVar60 * fVar60);
                        uVar17 = -(uint)(0.0 <= fVar48);
                        uVar34 = -(uint)(fVar48 <= 1.0);
                        fVar65 = (float)(~uVar17 & (uint)fVar65 |
                                        (~uVar34 & (uint)fVar65 | (uint)fVar50 & uVar34) & uVar17);
                      }
                    }
                  }
                  uVar29 = uVar29 + 1;
                  psVar22 = psVar22 + 1;
                } while (uVar30 != uVar29);
              }
              if (bVar33) {
                fVar65 = -fVar65;
              }
              fVar36 = fVar65 * local_180 + local_e0;
              fVar65 = 0.0;
              if ((0.0 <= fVar36) && (fVar65 = fVar36, 255.0 < fVar36)) {
                fVar65 = 255.0;
              }
              local_100[(local_17c - local_1dc) + (local_1f0 - local_1e4) * local_184] =
                   (uchar)(int)fVar65;
              iVar21 = local_17c + 1;
              puVar31 = local_100;
            } while (iVar21 < local_1e0);
          }
          local_1f0 = local_1f0 + 1;
        } while (local_1f0 < local_1e8);
      }
      psVar15 = local_b0;
      (**(code **)((long)local_b0->userdata + 0x10))(*local_b0->userdata,lVar32);
      (**(code **)((long)psVar15->userdata + 0x10))(*psVar15->userdata,local_f0);
      return puVar31;
    }
  }
  return (uchar *)0x0;
}

Assistant:

STBTT_DEF unsigned char * stbtt_GetGlyphSDF(const stbtt_fontinfo *info, float scale, int glyph, int padding, unsigned char onedge_value, float pixel_dist_scale, int *width, int *height, int *xoff, int *yoff)
{
float scale_x = scale, scale_y = scale;
int ix0,iy0,ix1,iy1;
int w,h;
unsigned char *data;

if (scale == 0) return NULL;

stbtt_GetGlyphBitmapBoxSubpixel(info, glyph, scale, scale, 0.0f,0.0f, &ix0,&iy0,&ix1,&iy1);

/*  if empty, return NULL */
if (ix0 == ix1 || iy0 == iy1)
return NULL;

ix0 -= padding;
iy0 -= padding;
ix1 += padding;
iy1 += padding;

w = (ix1 - ix0);
h = (iy1 - iy0);

if (width ) *width  = w;
if (height) *height = h;
if (xoff  ) *xoff   = ix0;
if (yoff  ) *yoff   = iy0;

/*  invert for y-downwards bitmaps */
scale_y = -scale_y;

{
int x,y,i,j;
float *precompute;
stbtt_vertex *verts;
int num_verts = stbtt_GetGlyphShape(info, glyph, &verts);
data = (unsigned char *) STBTT_malloc(w * h, info->userdata);
precompute = (float *) STBTT_malloc(num_verts * sizeof(float), info->userdata);

for (i=0,j=num_verts-1; i < num_verts; j=i++) {
if (verts[i].type == STBTT_vline) {
float x0 = verts[i].x*scale_x, y0 = verts[i].y*scale_y;
float x1 = verts[j].x*scale_x, y1 = verts[j].y*scale_y;
float dist = (float) STBTT_sqrt((x1-x0)*(x1-x0) + (y1-y0)*(y1-y0));
precompute[i] = (dist == 0) ? 0.0f : 1.0f / dist;
} else if (verts[i].type == STBTT_vcurve) {
float x2 = verts[j].x *scale_x, y2 = verts[j].y *scale_y;
float x1 = verts[i].cx*scale_x, y1 = verts[i].cy*scale_y;
float x0 = verts[i].x *scale_x, y0 = verts[i].y *scale_y;
float bx = x0 - 2*x1 + x2, by = y0 - 2*y1 + y2;
float len2 = bx*bx + by*by;
if (len2 != 0.0f)
precompute[i] = 1.0f / (bx*bx + by*by);
else
precompute[i] = 0.0f;
} else
precompute[i] = 0.0f;
}

for (y=iy0; y < iy1; ++y) {
for (x=ix0; x < ix1; ++x) {
float val;
float min_dist = 999999.0f;
float sx = (float) x + 0.5f;
float sy = (float) y + 0.5f;
float x_gspace = (sx / scale_x);
float y_gspace = (sy / scale_y);

int winding = stbtt__compute_crossings_x(x_gspace, y_gspace, num_verts, verts); /*  @OPTIMIZE: this could just be a rasterization, but needs to be line vs. non-tesselated curves so a new path */

for (i=0; i < num_verts; ++i) {
float x0 = verts[i].x*scale_x, y0 = verts[i].y*scale_y;

/*  check against every point here rather than inside line/curve primitives -- @TODO: wrong if multiple 'moves' in a row produce a garbage point, and given culling, probably more efficient to do within line/curve */
float dist2 = (x0-sx)*(x0-sx) + (y0-sy)*(y0-sy);
if (dist2 < min_dist*min_dist)
min_dist = (float) STBTT_sqrt(dist2);

if (verts[i].type == STBTT_vline) {
float x1 = verts[i-1].x*scale_x, y1 = verts[i-1].y*scale_y;

/*  coarse culling against bbox */
/* if (sx > STBTT_min(x0,x1)-min_dist && sx < STBTT_max(x0,x1)+min_dist && */
/*     sy > STBTT_min(y0,y1)-min_dist && sy < STBTT_max(y0,y1)+min_dist) */
float dist = (float) STBTT_fabs((x1-x0)*(y0-sy) - (y1-y0)*(x0-sx)) * precompute[i];
STBTT_assert(i != 0);
if (dist < min_dist) {
/*  check position along line */
/*  x' = x0 + t*(x1-x0), y' = y0 + t*(y1-y0) */
/*  minimize (x'-sx)*(x'-sx)+(y'-sy)*(y'-sy) */
float dx = x1-x0, dy = y1-y0;
float px = x0-sx, py = y0-sy;
/*  minimize (px+t*dx)^2 + (py+t*dy)^2 = px*px + 2*px*dx*t + t^2*dx*dx + py*py + 2*py*dy*t + t^2*dy*dy */
/*  derivative: 2*px*dx + 2*py*dy + (2*dx*dx+2*dy*dy)*t, set to 0 and solve */
float t = -(px*dx + py*dy) / (dx*dx + dy*dy);
if (t >= 0.0f && t <= 1.0f)
min_dist = dist;
}
} else if (verts[i].type == STBTT_vcurve) {
float x2 = verts[i-1].x *scale_x, y2 = verts[i-1].y *scale_y;
float x1 = verts[i  ].cx*scale_x, y1 = verts[i  ].cy*scale_y;
float box_x0 = STBTT_min(STBTT_min(x0,x1),x2);
float box_y0 = STBTT_min(STBTT_min(y0,y1),y2);
float box_x1 = STBTT_max(STBTT_max(x0,x1),x2);
float box_y1 = STBTT_max(STBTT_max(y0,y1),y2);
/*  coarse culling against bbox to avoid computing cubic unnecessarily */
if (sx > box_x0-min_dist && sx < box_x1+min_dist && sy > box_y0-min_dist && sy < box_y1+min_dist) {
int num=0;
float ax = x1-x0, ay = y1-y0;
float bx = x0 - 2*x1 + x2, by = y0 - 2*y1 + y2;
float mx = x0 - sx, my = y0 - sy;
float res[3],px,py,t,it;
float a_inv = precompute[i];
if (a_inv == 0.0) { /*  if a_inv is 0, it's 2nd degree so use quadratic formula */
float a = 3*(ax*bx + ay*by);
float b = 2*(ax*ax + ay*ay) + (mx*bx+my*by);
float c = mx*ax+my*ay;
if (a == 0.0) { /*  if a is 0, it's linear */
if (b != 0.0) {
res[num++] = -c/b;
}
} else {
float discriminant = b*b - 4*a*c;
if (discriminant < 0)
num = 0;
else {
float root = (float) STBTT_sqrt(discriminant);
res[0] = (-b - root)/(2*a);
res[1] = (-b + root)/(2*a);
num = 2; /*  don't bother distinguishing 1-solution case, as code below will still work */
}
}
} else {
float b = 3*(ax*bx + ay*by) * a_inv; /*  could precompute this as it doesn't depend on sample point */
float c = (2*(ax*ax + ay*ay) + (mx*bx+my*by)) * a_inv;
float d = (mx*ax+my*ay) * a_inv;
num = stbtt__solve_cubic(b, c, d, res);
}
if (num >= 1 && res[0] >= 0.0f && res[0] <= 1.0f) {
t = res[0], it = 1.0f - t;
px = it*it*x0 + 2*t*it*x1 + t*t*x2;
py = it*it*y0 + 2*t*it*y1 + t*t*y2;
dist2 = (px-sx)*(px-sx) + (py-sy)*(py-sy);
if (dist2 < min_dist * min_dist)
min_dist = (float) STBTT_sqrt(dist2);
}
if (num >= 2 && res[1] >= 0.0f && res[1] <= 1.0f) {
t = res[1], it = 1.0f - t;
px = it*it*x0 + 2*t*it*x1 + t*t*x2;
py = it*it*y0 + 2*t*it*y1 + t*t*y2;
dist2 = (px-sx)*(px-sx) + (py-sy)*(py-sy);
if (dist2 < min_dist * min_dist)
min_dist = (float) STBTT_sqrt(dist2);
}
if (num >= 3 && res[2] >= 0.0f && res[2] <= 1.0f) {
t = res[2], it = 1.0f - t;
px = it*it*x0 + 2*t*it*x1 + t*t*x2;
py = it*it*y0 + 2*t*it*y1 + t*t*y2;
dist2 = (px-sx)*(px-sx) + (py-sy)*(py-sy);
if (dist2 < min_dist * min_dist)
min_dist = (float) STBTT_sqrt(dist2);
}
}
}
}
if (winding == 0)
min_dist = -min_dist;  /*  if outside the shape, value is negative */
val = onedge_value + pixel_dist_scale * min_dist;
if (val < 0)
val = 0;
else if (val > 255)
val = 255;
data[(y-iy0)*w+(x-ix0)] = (unsigned char) val;
}
}
STBTT_free(precompute, info->userdata);
STBTT_free(verts, info->userdata);
}
return data;
}